

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitonicsort.hpp
# Opt level: O1

void mxx::impl::
     bitonic_split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
               (int *begin,int *end,long param_3,int param_4,int param_5)

{
  int iVar1;
  int iVar2;
  undefined4 *puVar3;
  pointer ppVar4;
  undefined4 *puVar5;
  long lVar6;
  int *piVar7;
  ulong __n;
  long lVar8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> merge_buf;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> recv_buf;
  datatype dt;
  
  lVar8 = (long)end - (long)begin;
  __n = lVar8 >> 3;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&recv_buf,__n,(allocator_type *)&merge_buf);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&merge_buf,__n,(allocator_type *)&dt);
  dt.mpitype = datatype_builder<std::pair<int,_int>_>::get_type();
  dt._vptr_datatype = (_func_int **)&PTR__datatype_0014c1e8;
  dt.builtin = false;
  MPI_Sendrecv(begin,__n & 0xffffffff,dt.mpitype,param_4,0,
               recv_buf.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,__n,dt.mpitype,param_4,0,
               *(undefined8 *)(param_3 + 8),0);
  if (param_5 == 1) {
    if (param_4 < *(int *)(param_3 + 0x14)) goto LAB_0010e4e0;
  }
  else if ((param_5 == 0) && (*(int *)(param_3 + 0x14) < param_4)) {
LAB_0010e4e0:
    if (end != begin) {
      lVar8 = 0;
      ppVar4 = recv_buf.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar7 = begin;
      do {
        iVar1 = piVar7[1];
        iVar2 = ppVar4->second;
        if (iVar1 < iVar2) {
          merge_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar8].first = *piVar7;
          merge_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar8].second = iVar1;
          piVar7 = piVar7 + 2;
        }
        else {
          merge_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar8].first = ppVar4->first;
          merge_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar8].second = iVar2;
          ppVar4 = ppVar4 + 1;
        }
        lVar8 = lVar8 + 1;
      } while (__n + (__n == 0) != lVar8);
    }
    goto LAB_0010e59f;
  }
  lVar6 = (long)end - (long)begin;
  if (lVar6 != 0) {
    puVar3 = (undefined4 *)
             ((long)recv_buf.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar8 + -8);
    puVar5 = (undefined4 *)((long)begin + lVar8 + -8);
    lVar8 = 0;
    do {
      iVar1 = puVar5[1];
      iVar2 = puVar3[1];
      if (iVar1 < iVar2) {
        *(undefined4 *)
         ((long)merge_buf.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar8 * 8 + lVar6 + -8) = *puVar3;
        *(int *)((long)merge_buf.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar8 * 8 + lVar6 + -4) = iVar2;
        puVar3 = puVar3 + -2;
      }
      else {
        *(undefined4 *)
         ((long)merge_buf.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar8 * 8 + lVar6 + -8) = *puVar5;
        *(int *)((long)merge_buf.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar8 * 8 + lVar6 + -4) = iVar1;
        puVar5 = puVar5 + -2;
      }
      lVar8 = lVar8 + -1;
    } while (-(ulong)(__n == 0) - __n != lVar8);
  }
LAB_0010e59f:
  lVar8 = (long)merge_buf.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)merge_buf.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (0 < lVar8) {
    lVar8 = lVar8 + 1;
    lVar6 = 0;
    do {
      *(undefined4 *)((long)begin + lVar6) =
           *(undefined4 *)
            ((long)&(merge_buf.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->first + lVar6);
      *(undefined4 *)((long)begin + lVar6 + 4) =
           *(undefined4 *)
            ((long)&(merge_buf.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->second + lVar6);
      lVar8 = lVar8 + -1;
      lVar6 = lVar6 + 8;
    } while (1 < lVar8);
  }
  datatype::~datatype(&dt);
  if (merge_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(merge_buf.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)merge_buf.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)merge_buf.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (recv_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(recv_buf.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)recv_buf.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)recv_buf.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void bitonic_split(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm, int partner, int dir) {
    typedef typename std::iterator_traits<_Iterator>::value_type T;
    size_t np = std::distance(begin, end);
    //std::cout << "[Rank " << comm.rank() << "]: split with partner= " << partner << ", dir=" << dir << std::endl;
    std::vector<T> recv_buf(np);
    std::vector<T> merge_buf(np);

    // send/recv
    mxx::datatype dt = mxx::get_datatype<T>();
    MPI_Sendrecv(&*begin, np, dt.type(), partner, 0,
                 &recv_buf[0], np, dt.type(), partner, 0, comm, MPI_STATUS_IGNORE);

    // merge in `dir` direction into merge buffer
    if ((dir == asc && partner > comm.rank()) || (dir == desc && partner < comm.rank())) {
        // forward merge and keep the `np` smaller elements
        _Iterator l = begin;
        typename std::vector<T>::iterator r = recv_buf.begin();
        typename std::vector<T>::iterator o = merge_buf.begin();

        for (size_t i = 0; i < np; ++i) {
            if (comp(*l, *r)) {
                *o = *l;
                ++o;
                ++l;
            } else {
                *o = *r;
                ++o;
                ++r;
            }
        }
    } else {
        // backward merge and keep the `np` larger elements
        _Iterator l = begin+np-1;
        typename std::vector<T>::iterator r = recv_buf.begin()+np-1;
        typename std::vector<T>::iterator o = merge_buf.begin()+np-1;

        for (size_t i = 0; i < np; ++i) {
            if (comp(*l, *r)) {
                *o = *r;
                --o;
                --r;
            } else {
                *o = *l;
                --o;
                --l;
            }
        }
    }
    // copy results into local buffer
    std::copy(merge_buf.begin(), merge_buf.end(), begin);
}